

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::RepeatedStringFieldGenerator::
GenerateSerializeWithCachedSizesToArray(RepeatedStringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"for (int i = 0; i < this->$name$_size(); i++) {\n");
  if ((*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x20) + 0x88) + 0x50) != 3) &&
     (*(int *)(this->descriptor_ + 0x2c) == 9)) {
    io::Printer::Print(printer,variables,
                       "  ::google::protobuf::internal::WireFormat::VerifyUTF8String(\n    this->$name$(i).data(), this->$name$(i).length(),\n    ::google::protobuf::internal::WireFormat::SERIALIZE);\n"
                      );
  }
  io::Printer::Print(printer,variables,
                     "  target = ::google::protobuf::internal::WireFormatLite::\n    Write$declared_type$ToArray($number$, this->$name$(i), target);\n}\n"
                    );
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) const {
  printer->Print(variables_,
    "for (int i = 0; i < this->$name$_size(); i++) {\n");
  if (HasUtf8Verification(descriptor_->file()) &&
      descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    printer->Print(variables_,
      "  ::google::protobuf::internal::WireFormat::VerifyUTF8String(\n"
      "    this->$name$(i).data(), this->$name$(i).length(),\n"
      "    ::google::protobuf::internal::WireFormat::SERIALIZE);\n");
  }
  printer->Print(variables_,
    "  target = ::google::protobuf::internal::WireFormatLite::\n"
    "    Write$declared_type$ToArray($number$, this->$name$(i), target);\n"
    "}\n");
}